

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImageText(Image *__return_storage_ptr__,int width,int height,char *text)

{
  int iVar1;
  size_t sVar2;
  void *__dest;
  int iVar3;
  
  sVar2 = strlen(text);
  iVar1 = height * width;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->format = 1;
  __dest = calloc((long)iVar1,1);
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->mipmaps = 1;
  iVar3 = (int)sVar2;
  if (iVar1 < (int)sVar2) {
    iVar3 = iVar1;
  }
  memcpy(__dest,text,(long)iVar3);
  return __return_storage_ptr__;
}

Assistant:

Image GenImageText(int width, int height, const char *text)
{
    Image image = { 0 };

    int textLength = (int)strlen(text);
    int imageViewSize = width*height;

    image.width = width;
    image.height = height;
    image.format = PIXELFORMAT_UNCOMPRESSED_GRAYSCALE;
    image.data = RL_CALLOC(imageViewSize, 1);
    image.mipmaps = 1;

    memcpy(image.data, text, (textLength > imageViewSize)? imageViewSize : textLength);

    return image;
}